

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void NULLCIO::ReadIntFromConsole(int *val)

{
  int iVar1;
  char local_98 [4];
  int result;
  char buf [128];
  int *val_local;
  
  if (val == (int *)0x0) {
    nullcThrowError("ERROR: argument should not be a nullptr");
  }
  else if (readFunc == 0) {
    nullcThrowError("ERROR: read stream is not avaiable");
  }
  else {
    ReadString(local_98,0x80);
    iVar1 = __isoc99_sscanf(local_98,"%d",val);
    if (iVar1 != 1) {
      nullcThrowError("ERROR: failed to read an int");
    }
  }
  return;
}

Assistant:

void ReadIntFromConsole(int* val)
	{
		if(!val)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return;
		}

		if(!readFunc)
		{
			nullcThrowError("ERROR: read stream is not avaiable");
			return;
		}

		char buf[128];
		ReadString(buf, 128);

		int result = sscanf(buf, "%d", val);

		if(result != 1)
		{
			nullcThrowError("ERROR: failed to read an int");
			return;
		}
	}